

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorOperations.cpp
# Opt level: O2

void __thiscall
helics::BinaryTranslatorOperation::BinaryTranslatorOperation(BinaryTranslatorOperation *this)

{
  (this->super_TranslatorOperations)._vptr_TranslatorOperations =
       (_func_int **)&PTR__BinaryTranslatorOperation_004563a0;
  std::make_shared<helics::BinaryTranslatorOperator>();
  return;
}

Assistant:

BinaryTranslatorOperation::BinaryTranslatorOperation():
    to(std::make_shared<BinaryTranslatorOperator>())
{
}